

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  _xmlNode **pp_Var1;
  xmlNodePtr cur;
  _xmlNode *old;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root,doc);
    root->parent = (_xmlNode *)doc;
    cur = doc->children;
    old = cur;
    if (cur != (xmlNodePtr)0x0) {
      do {
        if (old->type == XML_ELEMENT_NODE) {
          xmlReplaceNode(old,root);
          return old;
        }
        pp_Var1 = &old->next;
        old = *pp_Var1;
      } while (*pp_Var1 != (_xmlNode *)0x0);
      if (cur != (xmlNodePtr)0x0) {
        xmlAddSibling(cur,root);
        return (xmlNodePtr)0x0;
      }
    }
    doc->children = root;
    doc->last = root;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root, doc);
    root->parent = (xmlNodePtr) doc;
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}